

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catalog.cpp
# Opt level: O2

void duckdb::Catalog::AutoloadExtensionByConfigName
               (ClientContext *context,string *configuration_name)

{
  bool bVar1;
  DBConfig *pDVar2;
  CatalogException *__return_storage_ptr__;
  ExtensionEntry (*in_RCX) [62];
  string extension_name;
  
  pDVar2 = DBConfig::GetConfig(context);
  if ((pDVar2->options).autoload_known_extensions == true) {
    ExtensionHelper::FindExtensionInEntries<62ul>
              (&extension_name,(ExtensionHelper *)configuration_name,(string *)"azure_account_name",
               in_RCX);
    bVar1 = ExtensionHelper::CanAutoloadExtension(&extension_name);
    if (bVar1) {
      ExtensionHelper::AutoLoadExtension(context,&extension_name);
      ::std::__cxx11::string::~string((string *)&extension_name);
      return;
    }
    ::std::__cxx11::string::~string((string *)&extension_name);
  }
  __return_storage_ptr__ = (CatalogException *)__cxa_allocate_exception(0x10);
  UnrecognizedConfigurationError(__return_storage_ptr__,context,configuration_name);
  __cxa_throw(__return_storage_ptr__,&CatalogException::typeinfo,
              ::std::runtime_error::~runtime_error);
}

Assistant:

void Catalog::AutoloadExtensionByConfigName(ClientContext &context, const string &configuration_name) {
#ifndef DUCKDB_DISABLE_EXTENSION_LOAD
	auto &dbconfig = DBConfig::GetConfig(context);
	if (dbconfig.options.autoload_known_extensions) {
		auto extension_name = ExtensionHelper::FindExtensionInEntries(configuration_name, EXTENSION_SETTINGS);
		if (ExtensionHelper::CanAutoloadExtension(extension_name)) {
			ExtensionHelper::AutoLoadExtension(context, extension_name);
			return;
		}
	}
#endif

	throw Catalog::UnrecognizedConfigurationError(context, configuration_name);
}